

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O1

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_>::
writeErrorBars(AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_> *this,
              ostream *stream,string *errorMessage,ErrorHandling errorHandling)

{
  double dVar1;
  size_t i;
  int i_1;
  long lVar2;
  bool bVar3;
  double dVar4;
  Vector3d err;
  Vector<double,_3U> var;
  double local_78 [3];
  size_t local_60;
  Vector<double,_3U> local_58;
  string *local_40;
  double local_38;
  
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_60 = (this->super_Vector3dAccumulator).Count_;
  local_40 = errorMessage;
  if (errorHandling == Variance) {
    local_58.data_[0] = 0.0;
    local_58.data_[1] = 0.0;
    local_58.data_[2] = 0.0;
    lVar2 = 0;
    do {
      dVar1 = (this->super_Vector3dAccumulator).Avg_.data_[lVar2];
      dVar4 = (this->super_Vector3dAccumulator).Avg2_.data_[lVar2] - dVar1 * dVar1;
      dVar1 = 0.0;
      if (0.0 <= dVar4) {
        dVar1 = dVar4;
      }
      local_58.data_[lVar2] = dVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    local_78[2] = local_58.data_[2];
  }
  else {
    if (errorHandling == StdDev) {
      Accumulator<OpenMD::Vector<double,_3U>_>::getStdDev
                (&local_58,&this->super_Vector3dAccumulator);
    }
    else {
      if (errorHandling != CI95) goto LAB_00232352;
      Accumulator<OpenMD::Vector<double,_3U>_>::get95percentConfidenceInterval
                (&local_58,&this->super_Vector3dAccumulator);
    }
    local_78[2] = local_58.data_[2];
  }
  local_78[0] = local_58.data_[0];
  local_78[1] = local_58.data_[1];
  local_78[2] = local_58.data_[2];
LAB_00232352:
  bVar3 = local_60 == 0;
  lVar2 = 0;
  do {
    if (errorHandling == CI95 && bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
    }
    else if ((ulong)ABS(local_78[lVar2]) < 0x7ff0000000000000) {
      local_38 = local_78[lVar2];
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
      if (local_60 != 0) {
        std::ostream::_M_insert<double>(local_38);
      }
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(local_40->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      Vector3d err;
      std::size_t count = Vector3dAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = Vector3dAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = Vector3dAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = Vector3dAccumulator::getVariance();
        break;
      default:
        break;
      }

      for (int i = 0; i < Vector3dAccumulator::getAverage().size(); i++) {
        if (count == 0 && errorHandling == ErrorHandling::CI95) {
          stream << "\t";
        } else {
          if (std::isinf(err[i]) || std::isnan(err[i])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                     errorMessage.c_str());
            painCave.isFatal = 1;
            simError();
          } else {
            if (count == 0)
              stream << "\t";
            else
              stream << "\t" << err[i];
          }
        }
      }
    }